

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O1

int generateCombinatorialStabilExhaust
              (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Vec_Ptr_t *vDisj_nCk_,int combN,int combK)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  Aig_Obj_t *p1;
  int iVar8;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < combK + 2U) {
    iVar7 = combK + 3;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  p->pArray = piVar4;
  if (-1 < combK) {
    iVar7 = -1;
    do {
      Vec_IntPush(p,iVar7);
      iVar7 = iVar7 + 1;
    } while (combK != iVar7);
  }
  Vec_IntPush(p,combN);
  iVar7 = 0;
  Vec_IntPush(p,0);
  do {
    p1 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
    if (0 < combK) {
      iVar8 = p->nSize;
      uVar3 = combK;
      do {
        if (iVar8 <= combK) goto LAB_005b36ff;
        uVar2 = (pAigOld->nObjs[2] - pAigOld->nRegs) + p->pArray[uVar3];
        if (((int)uVar2 < 0) || (pAigOld->vCis->nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        p1 = Aig_Or(pAigNew,*(Aig_Obj_t **)((long)pAigOld->vCis->pArray[uVar2] + 0x28),p1);
        bVar1 = 1 < (int)uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar1);
    }
    uVar3 = vDisj_nCk_->nCap;
    if (vDisj_nCk_->nSize == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (vDisj_nCk_->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vDisj_nCk_->pArray,0x80);
        }
        vDisj_nCk_->pArray = ppvVar5;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar3 * 2;
        if (iVar8 <= (int)uVar3) goto LAB_005b3677;
        if (vDisj_nCk_->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vDisj_nCk_->pArray,(ulong)uVar3 << 4);
        }
        vDisj_nCk_->pArray = ppvVar5;
      }
      vDisj_nCk_->nCap = iVar8;
    }
LAB_005b3677:
    iVar8 = vDisj_nCk_->nSize;
    vDisj_nCk_->nSize = iVar8 + 1;
    vDisj_nCk_->pArray[iVar8] = p1;
    if ((p->nSize < 2) || (uVar3 = p->nSize - 1, uVar3 == 1)) {
LAB_005b36ff:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar7 = iVar7 + 1;
    piVar4 = p->pArray;
    lVar6 = 0;
    while( true ) {
      if (piVar4[lVar6 + 1] + 1 != piVar4[lVar6 + 2]) break;
      piVar4[lVar6 + 1] = (int)lVar6;
      lVar6 = lVar6 + 1;
      if ((ulong)uVar3 - 1 == lVar6) goto LAB_005b36ff;
    }
    if (combK < (int)lVar6 + 1) {
      if (piVar4 != (int *)0x0) {
        free(piVar4);
        p->pArray = (int *)0x0;
      }
      free(p);
      return iVar7;
    }
    piVar4[lVar6 + 1] = piVar4[lVar6 + 1] + 1;
  } while( true );
}

Assistant:

int generateCombinatorialStabilExhaust( Aig_Man_t *pAigNew, Aig_Man_t *pAigOld, 
				Vec_Ptr_t *vDisj_nCk_,
				int combN, int combK )
{
	Aig_Obj_t *pObjMonoCand, *pObj;
	int targetPoIndex;

	//Knuth's Data Strcuture
	int totalCombination_KNUTH = 0;
	Vec_Int_t *vC_KNUTH;
	int i_KNUTH, j_KNUTH;

	//Knuth's Data Structure Initialization
	vC_KNUTH = Vec_IntAlloc(combK+3);
	for(i_KNUTH=-1; i_KNUTH<combK; i_KNUTH++)
		Vec_IntPush( vC_KNUTH, i_KNUTH );
	Vec_IntPush( vC_KNUTH, combN );
	Vec_IntPush( vC_KNUTH, 0 );

	while(1)
	{
		totalCombination_KNUTH++;
		pObjMonoCand = Aig_Not(Aig_ManConst1(pAigNew));
		for( i_KNUTH=combK; i_KNUTH>0; i_KNUTH--)
		{
			//targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals_, Vec_IntEntry(vC_KNUTH, i_KNUTH));
			targetPoIndex = Vec_IntEntry(vC_KNUTH, i_KNUTH);
			pObj = (Aig_Obj_t *)(Aig_ManLo( pAigOld, targetPoIndex )->pData);
			pObjMonoCand = Aig_Or( pAigNew, pObj, pObjMonoCand );
		}
		Vec_PtrPush(vDisj_nCk_, pObjMonoCand );

		j_KNUTH = 1;
		while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
		{
			Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
			j_KNUTH = j_KNUTH + 1;
		}
		if( j_KNUTH > combK ) break;
		Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
	}

	Vec_IntFree(vC_KNUTH);

	return totalCombination_KNUTH;
}